

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::NextSubpass(DeviceContextGLImpl *this)

{
  DeviceContextGLImpl *this_local;
  
  EndSubpass(this);
  DeviceContextBase<Diligent::EngineGLImplTraits>::NextSubpass
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  BeginSubpass(this);
  std::vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>::clear
            (&this->m_AttachmentClearValues);
  return;
}

Assistant:

void DeviceContextGLImpl::NextSubpass()
{
    EndSubpass();
    TDeviceContextBase::NextSubpass();
    BeginSubpass();
    m_AttachmentClearValues.clear();
}